

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O3

uint capnp::compiler::anon_unknown_0::getOrdinal(Field field)

{
  Field field_00;
  StructSchema SVar1;
  uint uVar2;
  undefined1 in_stack_00000000 [40];
  void *in_stack_00000028;
  WirePointer *in_stack_00000030;
  uint in_stack_00000038;
  undefined4 in_stack_0000003c;
  StructSchema group;
  Fault local_90;
  FieldList local_88;
  Schema local_50;
  undefined4 uStack_48;
  StructReader local_40;
  
  if (in_stack_00000038 < 0x60) {
    if (in_stack_00000038 < 0x50) goto LAB_00150b4c;
  }
  else if (*(short *)((long)in_stack_00000028 + 10) == 1) {
    if (in_stack_00000038 < 0x70) {
      return 0;
    }
    return (uint)*(ushort *)((long)in_stack_00000028 + 0xc);
  }
  if (*(short *)((long)in_stack_00000028 + 8) == 1) {
    local_88._0_16_ = StructSchema::Field::getType((Field *)&stack0x00000008);
    local_90.exception = (Exception *)Type::asStruct((Type *)&local_88);
    StructSchema::getFields(&local_88,(StructSchema *)&local_90);
    SVar1.super_Schema.raw = local_88.parent.super_Schema.raw;
    _::ListReader::getStructElement(&local_40,(ListReader *)((long)&local_88 + 8),0);
    local_50 = SVar1.super_Schema.raw;
    uStack_48 = 0;
    field_00.proto._reader.pointers = (WirePointer *)in_stack_00000028;
    field_00.parent.super_Schema.raw = (Schema)(Schema)in_stack_00000000._0_8_;
    field_00.index = in_stack_00000000._8_4_;
    field_00._12_4_ = in_stack_00000000._12_4_;
    field_00.proto._reader.segment = (SegmentReader *)in_stack_00000000._16_8_;
    field_00.proto._reader.capTable = (CapTableReader *)in_stack_00000000._24_8_;
    field_00.proto._reader.data = (void *)in_stack_00000000._32_8_;
    field_00.proto._reader._32_8_ = in_stack_00000030;
    field_00.proto._reader.nestingLimit = in_stack_00000038;
    field_00.proto._reader._44_2_ = (StructPointerCount)in_stack_0000003c;
    field_00.proto._reader._46_2_ = SUB42(in_stack_0000003c,2);
    uVar2 = getOrdinal(field_00);
    return uVar2;
  }
LAB_00150b4c:
  local_90.exception = (Exception *)0x0;
  local_88._0_16_ = ZEXT816(0);
  kj::_::Debug::Fault::init
            (&local_90,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
            );
  kj::_::Debug::Fault::fatal(&local_90);
}

Assistant:

static ChangeInfo structPermuteFields(
    Declaration::Builder decl, uint& nextOrdinal, bool scopeHasUnion) {
  if (decl.getNestedDecls().size() == 0) {
    return { NO_CHANGE, "Permute field code order, but there were none." };
  }

  auto oldOrphan = decl.disownNestedDecls();
  auto old = oldOrphan.get();

  KJ_STACK_ARRAY(uint, mapping, old.size(), 16, 64);

  for (uint i = 0; i < mapping.size(); i++) {
    mapping[i] = i;
  }
  for (uint i = mapping.size() - 1; i > 0; i--) {
    uint j = rand() % i;
    uint temp = mapping[j];
    mapping[j] = mapping[i];
    mapping[i] = temp;
  }

  auto newNested = decl.initNestedDecls(old.size());
  for (uint i = 0; i < old.size(); i++) {
    newNested.setWithCaveats(i, old[mapping[i]]);
  }

  return { COMPATIBLE, "Permute field code order." };
}